

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DictTrie.hpp
# Opt level: O2

bool __thiscall cppjieba::DictTrie::InsertUserWord(DictTrie *this,string *word,string *tag)

{
  bool bVar1;
  _Elt_pointer pDVar2;
  DictUnit node_info;
  DictUnit local_90;
  
  local_90.word.ptr_ = (uint *)&local_90;
  local_90.word.size_ = 0;
  local_90.word.capacity_ = 0x10;
  local_90.tag._M_dataplus._M_p = (pointer)&local_90.tag.field_2;
  local_90.tag._M_string_length = 0;
  local_90.tag.field_2._M_local_buf[0] = '\0';
  bVar1 = MakeNodeInfo(this,(DictUnit *)local_90.word.ptr_,word,this->user_word_default_weight_,tag)
  ;
  if (bVar1) {
    std::deque<cppjieba::DictUnit,_std::allocator<cppjieba::DictUnit>_>::push_back
              (&this->active_node_infos_,&local_90);
    pDVar2 = (this->active_node_infos_).
             super__Deque_base<cppjieba::DictUnit,_std::allocator<cppjieba::DictUnit>_>._M_impl.
             super__Deque_impl_data._M_finish._M_cur;
    if (pDVar2 == (this->active_node_infos_).
                  super__Deque_base<cppjieba::DictUnit,_std::allocator<cppjieba::DictUnit>_>._M_impl
                  .super__Deque_impl_data._M_finish._M_first) {
      pDVar2 = (this->active_node_infos_).
               super__Deque_base<cppjieba::DictUnit,_std::allocator<cppjieba::DictUnit>_>._M_impl.
               super__Deque_impl_data._M_finish._M_node[-1] + 4;
    }
    Trie::InsertNode(this->trie_,&local_90.word,pDVar2 + -1);
  }
  DictUnit::~DictUnit(&local_90);
  return bVar1;
}

Assistant:

bool InsertUserWord(const string& word, const string& tag = UNKNOWN_TAG) {
    DictUnit node_info;
    if (!MakeNodeInfo(node_info, word, user_word_default_weight_, tag)) {
      return false;
    }
    active_node_infos_.push_back(node_info);
    trie_->InsertNode(node_info.word, &active_node_infos_.back());
    return true;
  }